

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_conn.cc
# Opt level: O2

Packet * __thiscall iqxmlrpc::Server_connection::read_request(Server_connection *this,string *s)

{
  Packet_reader *this_00;
  bool bVar1;
  Verification_level VVar2;
  size_t sVar3;
  Packet *pPVar4;
  
  VVar2 = Server::get_verification_level(this->server);
  (this->preader).ver_level_ = VVar2;
  sVar3 = Server::get_max_request_sz(this->server);
  this_00 = &this->preader;
  (this->preader).pkt_max_sz = sVar3;
  pPVar4 = http::Packet_reader::read_request(this_00,s);
  if (pPVar4 == (Packet *)0x0) {
    bVar1 = http::Packet_reader::expect_continue(this_00);
    if (bVar1) {
      std::__cxx11::string::assign((char *)&this->response);
      this->keep_alive = true;
      (*this->_vptr_Server_connection[2])(this);
      http::Packet_reader::set_continue_sent(this_00);
    }
  }
  else {
    bVar1 = http::Header::conn_keep_alive((pPVar4->header_).px);
    this->keep_alive = bVar1;
  }
  return pPVar4;
}

Assistant:

http::Packet* Server_connection::read_request( const std::string& s )
{
  try
  {
    preader.set_verification_level( server->get_verification_level() );
    preader.set_max_size( server->get_max_request_sz() );
    http::Packet* r = preader.read_request(s);

    if( r ) {
      keep_alive = r->header()->conn_keep_alive();
    } else if( preader.expect_continue() ) {
      response = "HTTP/1.1 100\r\n\r\n";
      keep_alive = true;
      do_schedule_response();
      preader.set_continue_sent();
    }

    return r;
  }
  catch( const http::Malformed_packet& )
  {
    throw http::Bad_request();
  }
}